

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_tensor_copy_async
               (ggml_backend_t backend_src,ggml_backend_t backend_dst,ggml_tensor *src,
               ggml_tensor *dst)

{
  _Bool _Var1;
  ulong uVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  
  _Var1 = ggml_are_same_layout(in_RDX,in_RCX);
  if (_Var1) {
    if ((in_RDX != in_RCX) &&
       ((*(long *)(in_RSI + 0x28) == 0 ||
        (uVar2 = (**(code **)(in_RSI + 0x28))(in_RDI,in_RSI,in_RDX,in_RCX), (uVar2 & 1) == 0)))) {
      ggml_backend_synchronize((ggml_backend_t)0x15ed59);
      ggml_backend_synchronize((ggml_backend_t)0x15ed63);
      ggml_backend_tensor_copy(src,dst);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x18a,"GGML_ASSERT(%s) failed",
             "ggml_are_same_layout(src, dst) && \"cannot copy tensors with different layouts\"");
}

Assistant:

void ggml_backend_tensor_copy_async(ggml_backend_t backend_src, ggml_backend_t backend_dst, struct ggml_tensor * src, struct ggml_tensor * dst) {
    GGML_ASSERT(ggml_are_same_layout(src, dst) && "cannot copy tensors with different layouts");

    if (src == dst) {
        return;
    }

    if (backend_dst->iface.cpy_tensor_async != NULL) {
        if (backend_dst->iface.cpy_tensor_async(backend_src, backend_dst, src, dst)) {
            return;
        }
    }

    // an async copy would normally happen after all the queued operations on both backends are completed
    // to simulate the same behavior, we need to synchronize both backends first, and do a blocking copy
    ggml_backend_synchronize(backend_src);
    ggml_backend_synchronize(backend_dst);
    ggml_backend_tensor_copy(src, dst);
}